

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::ChromeProcessDescriptor::ChromeProcessDescriptor
          (ChromeProcessDescriptor *this,ChromeProcessDescriptor *param_1)

{
  int32_t iVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ChromeProcessDescriptor_004081a8;
  iVar1 = param_1->process_priority_;
  this->process_type_ = param_1->process_type_;
  this->process_priority_ = iVar1;
  this->legacy_sort_index_ = param_1->legacy_sort_index_;
  ::std::__cxx11::string::string
            ((string *)&this->host_app_package_name_,(string *)&param_1->host_app_package_name_);
  this->crash_trace_id_ = param_1->crash_trace_id_;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ChromeProcessDescriptor::ChromeProcessDescriptor(ChromeProcessDescriptor&&) noexcept = default;